

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O0

string * __thiscall
wabt::cat<char[5],std::__cxx11::string,char[5],std::__cxx11::string,char[3]>
          (string *__return_storage_ptr__,wabt *this,char (*args) [5],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          char (*args_2) [5],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
          char (*args_4) [3])

{
  char (*args_local_4) [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_3;
  char (*args_local_2) [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char (*args_local) [5];
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  cat_compute_size<char[5],std::__cxx11::string,char[5],std::__cxx11::string,char[3]>
            ((char (*) [5])this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
             (char (*) [5])args_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_2,
             (char (*) [3])args_3);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  cat_concatenate<char[5],std::__cxx11::string,char[5],std::__cxx11::string,char[3]>
            (__return_storage_ptr__,(char (*) [5])this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
             (char (*) [5])args_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_2,
             (char (*) [3])args_3);
  return __return_storage_ptr__;
}

Assistant:

std::string cat(const Ts&... args) {
    std::string s;
    s.reserve(cat_compute_size(args...));
    cat_concatenate(s, args...);
    return s;
}